

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t b_delete(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ion_bpp_node_t *piVar1;
  int iVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_buffer_t *local_b8;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_key_t *tkey;
  ion_bpp_buffer_t *tbuf;
  ion_bpp_h_node_t *h;
  ion_bpp_buffer_t *gbuf;
  ion_bpp_buffer_t *root;
  ion_bpp_address_t iStack_80;
  uint lastGEkey;
  ion_bpp_address_t lastGE;
  int local_70;
  ion_bpp_bool_t lastLTvalid;
  ion_bpp_bool_t lastGEvalid;
  uint keyOff;
  ion_bpp_buffer_t *tmp [4];
  ion_bpp_buffer_t *buf;
  int cc;
  int len;
  ion_bpp_key_t *mkey;
  ion_bpp_external_address_t *piStack_28;
  int rc;
  ion_bpp_external_address_t *rec_local;
  void *key_local;
  ion_bpp_handle_t handle_local;
  
  gbuf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  h = (ion_bpp_h_node_t *)((long)handle + 0x80);
  local_70 = 0;
  lastGE._4_4_ = 0;
  tbuf = (ion_bpp_buffer_t *)handle;
  tmp[3] = gbuf;
  piStack_28 = rec;
  rec_local = (ion_bpp_external_address_t *)key;
  key_local = handle;
  do {
    while( true ) {
      if ((undefined1  [40])((undefined1  [40])*tmp[3]->p & (undefined1  [40])0x1) !=
          (undefined1  [40])0x0) {
        iVar2 = search(key_local,tmp[3],rec_local,*piStack_28,(ion_bpp_key_t **)&cc,MODE_MATCH);
        if (iVar2 == 0) {
          *piStack_28 = *(ion_bpp_external_address_t *)(_cc + *(int *)&tbuf->prev);
          lastLTvalid = (int)_cc - ((int)tmp[3]->p + 0x20);
          iVar2 = ((*(ushort *)tmp[3]->p >> 1) - 1) * *(int *)((long)&tbuf[4].p + 4) - lastLTvalid;
          if (iVar2 != 0) {
            memmove(_cc,_cc + *(int *)((long)&tbuf[4].p + 4),(long)iVar2);
          }
          piVar1 = tmp[3]->p;
          *(ushort *)piVar1 = *(ushort *)piVar1 & 1 | ((*(ushort *)piVar1 >> 1) - 1) * 2;
          mkey._4_4_ = writeDisk(tmp[3]);
          handle_local._4_4_ = mkey._4_4_;
          if (mkey._4_4_ == bErrOk) {
            if ((lastLTvalid == boolean_false) && (lastGE._4_4_ != 0)) {
              mkey._4_4_ = readDisk(key_local,iStack_80,(ion_bpp_buffer_t **)&tkey);
              if (mkey._4_4_ != bErrOk) {
                return mkey._4_4_;
              }
              cbuf = (ion_bpp_buffer_t *)(*(long *)(tkey + 0x18) + 0x20 + (ulong)root._4_4_);
              memcpy(cbuf,_cc,(long)*(int *)&tbuf->prev);
              *(undefined8 *)((long)&cbuf->next + (long)*(int *)&tbuf->prev) =
                   *(undefined8 *)(_cc + *(int *)&tbuf->prev);
              iVar3 = writeDisk((ion_bpp_buffer_t *)tkey);
              if (iVar3 != bErrOk) {
                return iVar3;
              }
            }
            nKeysDel = nKeysDel + 1;
            handle_local._4_4_ = bErrOk;
          }
        }
        else {
          handle_local._4_4_ = bErrKeyNotFound;
        }
        return handle_local._4_4_;
      }
      buf._0_4_ = search(key_local,tmp[3],rec_local,*piStack_28,(ion_bpp_key_t **)&cc,MODE_MATCH);
      if ((int)buf < 0) {
        iVar3 = readDisk(key_local,*(ion_bpp_address_t *)(_cc + -8),&local_b8);
      }
      else {
        iVar3 = readDisk(key_local,*(ion_bpp_address_t *)(_cc + (long)*(int *)&tbuf->prev + 8),
                         &local_b8);
      }
      if (iVar3 != bErrOk) {
        return iVar3;
      }
      mkey._4_4_ = 0;
      if ((uint)(*(ushort *)local_b8->p >> 1) == *(uint *)&tbuf[4].p >> 1) break;
LAB_001109ea:
      mkey._4_4_ = bErrOk;
      if (((int)buf < 0) && (_cc == &tmp[3]->p->fkey)) {
        if (local_70 != 0) {
          lastGE._4_4_ = 1;
        }
      }
      else {
        local_70 = 1;
        lastGE._4_4_ = 0;
        iStack_80 = tmp[3]->adr;
        root._4_4_ = (int)_cc - ((int)tmp[3]->p + 0x20);
        if ((int)buf < 0) {
          root._4_4_ = root._4_4_ - *(int *)((long)&tbuf[4].p + 4);
        }
      }
      tmp[3] = local_b8;
    }
    mkey._4_4_ = gather(key_local,tmp[3],(ion_bpp_key_t **)&cc,(ion_bpp_buffer_t **)&lastGEvalid);
    if (mkey._4_4_ != bErrOk) {
      return mkey._4_4_;
    }
    if (((tmp[3] != gbuf) || (*(ushort *)gbuf->p >> 1 != 2)) ||
       ((uint)(*(int *)&tbuf[4].p * 9) >> 2 <= (uint)(*(ushort *)h->comp >> 1))) {
      mkey._4_4_ = scatter(key_local,tmp[3],_cc,3,(ion_bpp_buffer_t **)&lastGEvalid);
      if (mkey._4_4_ != bErrOk) {
        return mkey._4_4_;
      }
      buf._0_4_ = search(key_local,tmp[3],rec_local,*piStack_28,(ion_bpp_key_t **)&cc,MODE_MATCH);
      if ((int)buf < 0) {
        iVar3 = readDisk(key_local,*(ion_bpp_address_t *)(_cc + -8),&local_b8);
        if (iVar3 != bErrOk) {
          return iVar3;
        }
      }
      else {
        iVar3 = readDisk(key_local,*(ion_bpp_address_t *)(_cc + (long)*(int *)&tbuf->prev + 8),
                         &local_b8);
        if (iVar3 != bErrOk) {
          return iVar3;
        }
      }
      goto LAB_001109ea;
    }
    scatterRoot(key_local);
    nNodesDel = nNodesDel + 3;
  } while( true );
}

Assistant:

ion_bpp_err_t
b_delete(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;			/* match key */
	int					len;	/* length to shift */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_buffer_t	*tmp[4];
	unsigned int		keyOff;
	ion_bpp_bool_t		lastGEvalid;		/* true if GE branch taken */
	ion_bpp_bool_t		lastLTvalid;		/* true if LT branch taken after GE branch */
	ion_bpp_address_t	lastGE;			/* last childGE traversed */
	unsigned int		lastGEkey;	/* last childGE key traversed */
	ion_bpp_buffer_t	*root;
	ion_bpp_buffer_t	*gbuf;

	ion_bpp_h_node_t *h = handle;

	root		= &h->root;
	gbuf		= &h->gbuf;
	lastGEvalid = boolean_false;
	lastLTvalid = boolean_false;

	buf			= root;

	while (1) {
		if (leaf(buf)) {
			/* set mkey to point to deletion point */
			if (search(handle, buf, key, *rec, &mkey, MODE_MATCH) == 0) {
				*rec = rec(mkey);
			}
			else {
				return bErrKeyNotFound;
			}

			/* shift items GT key to left */
			keyOff	= mkey - fkey(buf);
			len		= ks(ct(buf) - 1) - keyOff;

			if (len) {
				memmove(mkey, mkey + ks(1), len);
			}

			ct(buf)--;

			if ((rc = writeDisk(buf)) != 0) {
				return rc;
			}

			/* if deleted key is first key, then fixup lastGE key */
			if (!keyOff && lastLTvalid) {
				ion_bpp_buffer_t	*tbuf;
				ion_bpp_key_t		*tkey;

				if ((rc = readDisk(handle, lastGE, &tbuf)) != 0) {
					return rc;
				}

				tkey		= fkey(tbuf) + lastGEkey;
				memcpy(key(tkey), mkey, h->keySize);
				rec(tkey)	= rec(mkey);

				if ((rc = writeDisk(tbuf)) != 0) {
					return rc;
				}
			}

			nKeysDel++;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			/* read child */
			if ((cc = search(handle, buf, key, *rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room to delete */
			if (ct(cbuf) == h->maxCt / 2) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				/* if last 3 bufs in root, and count is low enough... */
				if ((buf == root) && (ct(root) == 2) && (ct(gbuf) < (3 * (3 * h->maxCt)) / 4)) {
					/* collapse tree by one level */
					scatterRoot(handle);
					nNodesDel += 3;
					continue;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, *rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			if ((cc >= 0) || (mkey != fkey(buf))) {
				lastGEvalid = boolean_true;
				lastLTvalid = boolean_false;
				lastGE		= buf->adr;
				lastGEkey	= mkey - fkey(buf);

				if (cc < 0) {
					lastGEkey -= ks(1);
				}
			}
			else {
				if (lastGEvalid) {
					lastLTvalid = boolean_true;
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}